

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmVariableAccess(LlvmCompilationContext *ctx,ExprVariableAccess *node)

{
  LLVMBuilderRef pLVar1;
  LLVMValueRefOpaque **ppLVar2;
  char *pcVar3;
  LLVMValueRef pLVar4;
  LLVMValueRef *value;
  ExprVariableAccess *node_local;
  LlvmCompilationContext *ctx_local;
  
  ppLVar2 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
            find(&ctx->variables,&node->variable->uniqueId);
  if (ppLVar2 != (LLVMValueRefOpaque **)0x0) {
    pLVar1 = ctx->builder;
    pLVar4 = *ppLVar2;
    pcVar3 = CreateLlvmName(ctx,node->variable->name->name);
    pLVar4 = LLVMBuildLoad(pLVar1,pLVar4,pcVar3);
    pLVar4 = ConvertToStackType(ctx,pLVar4,node->variable->type);
    pLVar4 = CheckType(ctx,&node->super_ExprBase,pLVar4);
    return pLVar4;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x668,
                "LLVMValueRef CompileLlvmVariableAccess(LlvmCompilationContext &, ExprVariableAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmVariableAccess(LlvmCompilationContext &ctx, ExprVariableAccess *node)
{
	LLVMValueRef *value = ctx.variables.find(node->variable->uniqueId);

	assert(value);

	return CheckType(ctx, node, ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, *value, CreateLlvmName(ctx, node->variable->name->name)), node->variable->type));
}